

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remove_if.hpp
# Opt level: O0

void __thiscall
ranges::
remove_if_view<ranges::filter_view<ranges::filter_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/Ethiraric[P]cpptalksindex/src/TalksDB.cpp:17:10)>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/Ethiraric[P]cpptalksindex/src/TalksDB.cpp:24:10)>,_ranges::logical_negate<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/Ethiraric[P]cpptalksindex/src/TalksDB.cpp:34:10)>_>
::cache_begin(remove_if_view<ranges::filter_view<ranges::filter_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:24:10)>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:34:10)>_>
              *this)

{
  bool bVar1;
  base_range_t *pbVar2;
  undefined1 local_28 [8];
  enable_if_t<detail::facade_iterator_t<remove_if_view<filter_view<ref_view<const_vector<reference_wrapper<const_TalkRef>,_allocator<reference_wrapper<const_TalkRef>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>,_logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:24:10)>_>_>,_static_cast<bool>(same_as<ranges::remove_if_view<ranges::filter_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:24:10)>_>,_ranges::remove_if_view<ranges::filter_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:24:10)>_>_>)____CPP_false(::concepts::detail::xNil__)>
  it;
  remove_if_view<ranges::filter_view<ranges::filter_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:24:10)>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:34:10)>_>
  *this_local;
  
  it.
  super_iterator_associated_types_base<ranges::adaptor_cursor<ranges::basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_std::reference_wrapper<const_cppti::TalksDB::TalkRef>_*,_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>,_ranges::remove_if_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>_>::adaptor>_>,_ranges::remove_if_view<ranges::filter_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:24:10)>_>::adaptor>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<ranges::basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_std::reference_wrapper<const_cppti::TalksDB::TalkRef>_*,_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::remove_if_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>_>::adaptor>_>,_ranges::remove_if_view<ranges::filter_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:24:10)>_>::adaptor>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<ranges::basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_std::reference_wrapper<const_cppti::TalksDB::TalkRef>_*,_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>,_ranges::remove_if_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>_>::adaptor>_>,_ranges::remove_if_view<ranges::filter_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:24:10)>_>::adaptor>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<ranges::basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_std::reference_wrapper<const_cppti::TalksDB::TalkRef>_*,_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::remove_if_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>_>::adaptor>_>,_ranges::remove_if_view<ranges::filter_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:24:10)>_>::adaptor>_>
  .
  super_box<ranges::adaptor_cursor<ranges::basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_std::reference_wrapper<const_cppti::TalksDB::TalkRef>_*,_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::remove_if_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>_>::adaptor>_>,_ranges::remove_if_view<ranges::filter_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:24:10)>_>::adaptor>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<ranges::basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_std::reference_wrapper<const_cppti::TalksDB::TalkRef>_*,_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::remove_if_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>_>::adaptor>_>,_ranges::remove_if_view<ranges::filter_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:24:10)>_>::adaptor,_1>
  .data_.
  super_box<ranges::remove_if_view<ranges::filter_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:24:10)>_>::adaptor,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
  .value.rng_ = (adaptor)(adaptor)this;
  bVar1 = optional::operator_cast_to_bool((optional *)&this->begin_);
  if (!bVar1) {
    pbVar2 = view_adaptor<ranges::remove_if_view<ranges::filter_view<ranges::filter_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/Ethiraric[P]cpptalksindex/src/TalksDB.cpp:17:10)>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/Ethiraric[P]cpptalksindex/src/TalksDB.cpp:24:10)>,_ranges::logical_negate<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/Ethiraric[P]cpptalksindex/src/TalksDB.cpp:34:10)>_>,_ranges::filter_view<ranges::filter_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/Ethiraric[P]cpptalksindex/src/TalksDB.cpp:17:10)>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/Ethiraric[P]cpptalksindex/src/TalksDB.cpp:24:10)>,_(ranges::cardinality)-1>
             ::base(&this->
                     super_view_adaptor<ranges::remove_if_view<ranges::filter_view<ranges::filter_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:24:10)>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:34:10)>_>,_ranges::filter_view<ranges::filter_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:24:10)>,_(ranges::cardinality)_1>
                   );
    _begin_::fn::operator()(local_28,(fn *)&_::begin,pbVar2);
    satisfy_forward(this,(iterator_t<ranges::filter_view<ranges::filter_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:24:10)>_>
                          *)local_28);
    optional<ranges::basic_iterator<ranges::adaptor_cursor<ranges::basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<std::reference_wrapper<cppti::TalksDB::TalkRef_const>const*,std::vector<std::reference_wrapper<cppti::TalksDB::TalkRef_const>,std::allocator<std::reference_wrapper<cppti::TalksDB::TalkRef_const>>>>,ranges::remove_if_view<ranges::ref_view<std::vector<std::reference_wrapper<cppti::TalksDB::TalkRef_const>,std::allocator<std::reference_wrapper<cppti::TalksDB::TalkRef_const>>>const>,ranges::logical_negate<cppti::(anonymous_namespace)::getConferenceFilter(std::basic_string_view<char,std::char_traits<char>>)::$_0>>::adaptor>>,ranges::remove_if_view<ranges::filter_view<ranges::ref_view<std::vector<std::reference_wrapper<cppti::TalksDB::TalkRef_const>,std::allocator<std::reference_wrapper<cppti::TalksDB::TalkRef_const>>>const>,cppti::(anonymous_namespace)::getConferenceFilter(std::basic_string_view<char,std::char_traits<char>>)::$_0>,ranges::logical_negate<cppti::(anonymous_namespace)::getTagsFilter(gsl::span<std::basic_string_view<char,std::char_traits<char>>const,-1l>)::$_0>>::adaptor>>>
    ::
    emplace<ranges::basic_iterator<ranges::adaptor_cursor<ranges::basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<std::reference_wrapper<cppti::TalksDB::TalkRef_const>const*,std::vector<std::reference_wrapper<cppti::TalksDB::TalkRef_const>,std::allocator<std::reference_wrapper<cppti::TalksDB::TalkRef_const>>>>,ranges::remove_if_view<ranges::ref_view<std::vector<std::reference_wrapper<cppti::TalksDB::TalkRef_const>,std::allocator<std::reference_wrapper<cppti::TalksDB::TalkRef_const>>>const>,ranges::logical_negate<cppti::(anonymous_namespace)::getConferenceFilter(std::basic_string_view<char,std::char_traits<char>>)::__0>>::adaptor>>,ranges::remove_if_view<ranges::filter_view<ranges::ref_view<std::vector<std::reference_wrapper<cppti::TalksDB::TalkRef_const>,std::allocator<std::reference_wrapper<cppti::TalksDB::TalkRef_const>>>const>,cppti::(anonymous_namespace)::getConferenceFilter(std::basic_string_view<char,std::char_traits<char>>)::__0>,ranges::logical_negate<cppti::(anonymous_namespace)::getTagsFilter(gsl::span<std::basic_string_view<char,std::char_traits<char>>const,_1l>)::__0>>::adaptor>>>
              ((optional<ranges::basic_iterator<ranges::adaptor_cursor<ranges::basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<std::reference_wrapper<cppti::TalksDB::TalkRef_const>const*,std::vector<std::reference_wrapper<cppti::TalksDB::TalkRef_const>,std::allocator<std::reference_wrapper<cppti::TalksDB::TalkRef_const>>>>,ranges::remove_if_view<ranges::ref_view<std::vector<std::reference_wrapper<cppti::TalksDB::TalkRef_const>,std::allocator<std::reference_wrapper<cppti::TalksDB::TalkRef_const>>>const>,ranges::logical_negate<cppti::(anonymous_namespace)::getConferenceFilter(std::basic_string_view<char,std::char_traits<char>>)::__0>>::adaptor>>,ranges::remove_if_view<ranges::filter_view<ranges::ref_view<std::vector<std::reference_wrapper<cppti::TalksDB::TalkRef_const>,std::allocator<std::reference_wrapper<cppti::TalksDB::TalkRef_const>>>const>,cppti::(anonymous_namespace)::getConferenceFilter(std::basic_string_view<char,std::char_traits<char>>)::__0>,ranges::logical_negate<cppti::(anonymous_namespace)::getTagsFilter(gsl::span<std::basic_string_view<char,std::char_traits<char>>const,_1l>)::__0>>::adaptor>>>
                *)&this->begin_,
               (basic_iterator<ranges::adaptor_cursor<ranges::basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_std::reference_wrapper<const_cppti::TalksDB::TalkRef>_*,_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::remove_if_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>_>::adaptor>_>,_ranges::remove_if_view<ranges::filter_view<ranges::ref_view<const_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:17:10)>,_ranges::logical_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Ethiraric[P]cpptalksindex_src_TalksDB_cpp:24:10)>_>::adaptor>_>
                *)local_28);
  }
  return;
}

Assistant:

constexpr void cache_begin()
        {
            if(begin_)
                return;
            auto it = ranges::begin(this->base());
            satisfy_forward(it);
            begin_.emplace(std::move(it));
        }